

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

string * __thiscall
lan::db::write_bit_abi_cxx11_(string *__return_storage_ptr__,db *this,db_bit *bit,bool in_array)

{
  string local_98;
  string local_78;
  string local_48;
  undefined1 local_22;
  byte local_21;
  db_bit *pdStack_20;
  bool in_array_local;
  db_bit *bit_local;
  db *this_local;
  string *bit_str;
  
  local_22 = 0;
  local_21 = in_array;
  pdStack_20 = bit;
  bit_local = (db_bit *)this;
  this_local = (db *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if ((int)pdStack_20->type < 9) {
    write_var_bit_abi_cxx11_(&local_48,this,pdStack_20,(bool)(local_21 & 1));
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else if (pdStack_20->type == Array) {
    write_array_bit_abi_cxx11_(&local_78,this,pdStack_20);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    write_container_bit_abi_cxx11_(&local_98,this,pdStack_20);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string db::write_bit(db_bit * bit, bool in_array){
            std::string bit_str;
            if(bit->type <= Unsafe){
                bit_str = write_var_bit(bit, in_array);
            } else if(bit->type == Array){
                bit_str = write_array_bit(bit);
            } else {
                bit_str = write_container_bit(bit);
            } return bit_str;
        }